

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.cpp
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::DuplicateColumn::undoFix
          (DuplicateColumn *this,HighsOptions *options,HighsSolution *solution)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  double *pdVar4;
  long in_RDX;
  long in_RSI;
  double *in_RDI;
  bool check;
  bool x_y_ok;
  double residual;
  double residual_tolerance;
  double v_m_a_yup;
  double v_m_a_ylo;
  bool found_x;
  double y_free;
  double y_1;
  double y_d;
  double y_0;
  bool found_y;
  double x_free;
  double x_1;
  double x_d;
  double x_0;
  double y_v;
  double x_v;
  double y_up;
  double y_lo;
  double x_up;
  double x_lo;
  int y_ix;
  int x_ix;
  bool y_int;
  bool x_int;
  double scale;
  double eps;
  double value_max;
  double merge_value;
  anon_class_8_1_efae81bf isFeasible;
  anon_class_8_1_480c3b24 isInteger;
  bool debug_report;
  bool allow_assert;
  vector<double,_std::allocator<double>_> *col_value;
  double primal_feasibility_tolerance;
  double mip_feasibility_tolerance;
  HighsCDouble *in_stack_fffffffffffffb58;
  HighsCDouble *in_stack_fffffffffffffb60;
  double dVar5;
  double in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb74;
  undefined1 in_stack_fffffffffffffb75;
  undefined1 in_stack_fffffffffffffb76;
  undefined1 in_stack_fffffffffffffb77;
  double local_488;
  double local_480;
  double local_478;
  double local_470;
  HighsCDouble local_458;
  HighsCDouble local_448;
  HighsCDouble local_438;
  HighsCDouble local_428;
  HighsCDouble local_418;
  HighsCDouble local_408;
  double local_3f8;
  undefined8 local_3f0;
  HighsCDouble local_3e8;
  HighsCDouble local_3d8;
  HighsCDouble local_3c8;
  double local_3b8;
  HighsCDouble local_3b0;
  HighsCDouble local_3a0;
  HighsCDouble local_390;
  HighsCDouble local_380;
  HighsCDouble local_370;
  HighsCDouble local_360;
  HighsCDouble local_350;
  HighsCDouble local_340;
  HighsCDouble local_330;
  HighsCDouble local_320;
  HighsCDouble local_310;
  HighsCDouble local_300;
  HighsCDouble local_2f0;
  HighsCDouble local_2e0;
  HighsCDouble local_2d0;
  double local_2c0;
  HighsCDouble local_2b8;
  HighsCDouble local_2a8;
  HighsCDouble local_298;
  HighsCDouble local_288;
  HighsCDouble local_278;
  HighsCDouble local_268;
  HighsCDouble local_258;
  HighsCDouble local_248;
  HighsCDouble local_238;
  HighsCDouble local_228;
  HighsCDouble local_218;
  HighsCDouble local_208;
  HighsCDouble local_1f8;
  HighsCDouble local_1e8;
  HighsCDouble local_1d8;
  HighsCDouble local_1c8;
  HighsCDouble local_1b8;
  HighsCDouble local_1a8;
  HighsCDouble local_198;
  HighsCDouble local_188;
  double local_178;
  double local_170;
  HighsCDouble local_168;
  HighsCDouble local_158;
  HighsCDouble local_148;
  HighsCDouble local_138;
  undefined1 local_121;
  undefined8 local_120;
  double local_118;
  double local_110;
  double local_108;
  HighsCDouble local_100;
  HighsCDouble local_f0;
  HighsCDouble local_e0;
  undefined1 local_c9;
  undefined8 local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  int local_74;
  int local_70;
  byte local_6a;
  byte local_69;
  double local_68;
  undefined8 local_60;
  undefined8 local_58;
  value_type local_50;
  anon_class_8_1_efae81bf local_48;
  double *local_40;
  undefined1 local_32;
  undefined1 local_31;
  vector<double,_std::allocator<double>_> *local_30;
  double local_28;
  double local_20 [4];
  
  local_20[0] = *(double *)(in_RSI + 0x328);
  local_28 = *(double *)(in_RSI + 0x118);
  local_30 = (vector<double,_std::allocator<double>_> *)(in_RDX + 8);
  local_31 = 0;
  local_32 = 0;
  local_40 = local_20;
  local_48.primal_feasibility_tolerance = &local_28;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     (local_30,(long)*(int *)(in_RDI + 5));
  local_50 = *pvVar3;
  local_58 = 0x408f400000000000;
  local_60 = 0x3e45798ee2308c3a;
  local_68 = *in_RDI;
  local_69 = *(byte *)(in_RDI + 6) & 1;
  local_6a = *(byte *)((long)in_RDI + 0x31) & 1;
  local_70 = *(int *)(in_RDI + 5);
  local_74 = *(int *)((long)in_RDI + 0x2c);
  if (local_69 == 0) {
    local_470 = in_RDI[1];
  }
  else {
    local_470 = ceil(in_RDI[1] - local_20[0]);
  }
  local_80 = local_470;
  if ((local_69 & 1) == 0) {
    local_478 = in_RDI[2];
  }
  else {
    local_478 = floor(in_RDI[2] + local_20[0]);
  }
  local_88 = local_478;
  if ((local_6a & 1) == 0) {
    local_480 = in_RDI[3];
  }
  else {
    local_480 = ceil(in_RDI[3] - local_20[0]);
  }
  local_90 = local_480;
  if ((local_6a & 1) == 0) {
    local_488 = in_RDI[4];
  }
  else {
    local_488 = floor(in_RDI[4] + local_20[0]);
  }
  local_98 = local_488;
  local_a0 = local_50;
  if ((local_69 & 1) != 0) {
    local_c8 = 0;
    if (-INFINITY < local_80) {
      if (local_88 < INFINITY) {
        local_c0 = local_88;
      }
      else {
        local_c0 = 1000.0;
      }
      local_b0 = local_80;
      local_b8 = 1.0;
    }
    else if (local_88 < INFINITY) {
      local_b0 = local_88;
      local_b8 = -1.0;
      local_c0 = -1000.0;
    }
    else {
      local_c8 = 0x3ff0000000000000;
      local_b0 = 0.0;
      local_b8 = 1.0;
      local_c0 = 1000.0;
    }
    local_c9 = 0;
    local_a0 = local_b0;
    do {
      HighsCDouble::HighsCDouble(&local_100,local_50);
      local_f0 = HighsCDouble::operator-
                           (in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58);
      local_e0 = HighsCDouble::operator/(in_stack_fffffffffffffb58,3.49798427849038e-317);
      local_a8 = HighsCDouble::operator_cast_to_double(&local_e0);
      bVar1 = undoFix::anon_class_8_1_efae81bf::operator()(&local_48,local_90,local_a8,local_98);
      if (bVar1) {
        in_stack_fffffffffffffb77 = true;
        if ((local_6a & 1) != 0) {
          in_stack_fffffffffffffb77 =
               undoFix::anon_class_8_1_480c3b24::operator()
                         ((anon_class_8_1_480c3b24 *)in_stack_fffffffffffffb60,
                          (double)in_stack_fffffffffffffb58);
        }
        local_c9 = in_stack_fffffffffffffb77;
        if ((bool)in_stack_fffffffffffffb77 != false) goto LAB_006c16fb;
      }
      if (((0.0 < local_b8) && (local_c0 + 1e-08 <= local_a0 + local_b8)) ||
         ((local_b8 < 0.0 && (local_a0 + local_b8 <= local_c0 - 1e-08)))) goto LAB_006c16fb;
      local_a0 = local_b8 + local_a0;
    } while( true );
  }
  if ((local_6a & 1) != 0) {
    local_120 = 0;
    if (-INFINITY < local_90) {
      if (local_488 < INFINITY) {
        local_118 = local_488;
      }
      else {
        local_118 = 1000.0;
      }
      local_108 = local_90;
      local_110 = 1.0;
    }
    else if (local_488 < INFINITY) {
      local_108 = local_488;
      local_110 = -1.0;
      local_118 = -1000.0;
    }
    else {
      local_120 = 0x3ff0000000000000;
      local_108 = 0.0;
      local_110 = 1.0;
      local_118 = 1000.0;
    }
    local_121 = 0;
    local_a8 = local_108;
    do {
      HighsCDouble::HighsCDouble(&local_148,local_50);
      HighsCDouble::HighsCDouble(&local_168,local_a8);
      local_158 = HighsCDouble::operator*
                            ((HighsCDouble *)
                             CONCAT17(in_stack_fffffffffffffb77,
                                      CONCAT16(in_stack_fffffffffffffb76,
                                               CONCAT15(in_stack_fffffffffffffb75,
                                                        CONCAT14(in_stack_fffffffffffffb74,
                                                                 in_stack_fffffffffffffb70)))),
                             in_stack_fffffffffffffb68);
      local_138 = HighsCDouble::operator-(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      local_a0 = HighsCDouble::operator_cast_to_double(&local_138);
      bVar1 = undoFix::anon_class_8_1_efae81bf::operator()(&local_48,local_80,local_a0,local_88);
      if (bVar1) {
        in_stack_fffffffffffffb76 = true;
        if ((local_69 & 1) != 0) {
          in_stack_fffffffffffffb76 =
               undoFix::anon_class_8_1_480c3b24::operator()
                         ((anon_class_8_1_480c3b24 *)in_stack_fffffffffffffb60,
                          (double)in_stack_fffffffffffffb58);
        }
        local_121 = in_stack_fffffffffffffb76;
        if ((bool)in_stack_fffffffffffffb76 != false) goto LAB_006c16fb;
      }
      if (((0.0 < local_110) && (local_118 + 1e-08 <= local_a8 + local_110)) ||
         ((local_110 < 0.0 && (local_a8 + local_110 <= local_118 - 1e-08)))) goto LAB_006c16fb;
      local_a8 = local_110 + local_a8;
    } while( true );
  }
  local_170 = 0.0;
  local_178 = 0.0;
  if (-INFINITY < local_90) {
    HighsCDouble::HighsCDouble(&local_198,local_50);
    HighsCDouble::HighsCDouble(&local_1b8,local_90);
    local_1a8 = HighsCDouble::operator*
                          ((HighsCDouble *)
                           CONCAT17(in_stack_fffffffffffffb77,
                                    CONCAT16(in_stack_fffffffffffffb76,
                                             CONCAT15(in_stack_fffffffffffffb75,
                                                      CONCAT14(in_stack_fffffffffffffb74,
                                                               in_stack_fffffffffffffb70)))),
                           in_stack_fffffffffffffb68);
    local_188 = HighsCDouble::operator-(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    local_170 = HighsCDouble::operator_cast_to_double(&local_188);
  }
  else {
    local_170 = (double)(~-(ulong)(0.0 < local_68) & 0xfff0000000000000 |
                        -(ulong)(0.0 < local_68) & 0x7ff0000000000000);
  }
  if (local_98 < INFINITY) {
    HighsCDouble::HighsCDouble(&local_1d8,local_50);
    HighsCDouble::HighsCDouble(&local_1f8,local_98);
    local_1e8 = HighsCDouble::operator*
                          ((HighsCDouble *)
                           CONCAT17(in_stack_fffffffffffffb77,
                                    CONCAT16(in_stack_fffffffffffffb76,
                                             CONCAT15(in_stack_fffffffffffffb75,
                                                      CONCAT14(in_stack_fffffffffffffb74,
                                                               in_stack_fffffffffffffb70)))),
                           in_stack_fffffffffffffb68);
    local_1c8 = HighsCDouble::operator-(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    local_178 = HighsCDouble::operator_cast_to_double(&local_1c8);
  }
  else {
    local_178 = (double)(~-(ulong)(0.0 < local_68) & 0x7ff0000000000000 |
                        -(ulong)(0.0 < local_68) & 0xfff0000000000000);
  }
  if (local_68 <= 0.0) {
    if (local_90 <= -INFINITY) {
      if (INFINITY <= local_98) {
        local_3b8 = 0.0;
        pdVar4 = std::max<double>(&local_3b8,&local_80);
        local_a0 = *pdVar4;
        HighsCDouble::HighsCDouble(&local_3e8,local_50);
        local_3d8 = HighsCDouble::operator-
                              (in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58);
        local_3c8 = HighsCDouble::operator/(in_stack_fffffffffffffb58,3.49982417895549e-317);
        local_a8 = HighsCDouble::operator_cast_to_double(&local_3c8);
      }
      else {
        local_a8 = local_98;
        local_a0 = local_178;
        if (local_88 + local_28 < local_178) {
          local_a0 = local_88;
          HighsCDouble::HighsCDouble(&local_380,local_50);
          local_370 = HighsCDouble::operator-
                                (in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58);
          local_360 = HighsCDouble::operator/(in_stack_fffffffffffffb58,3.49964384499476e-317);
          local_a8 = HighsCDouble::operator_cast_to_double(&local_360);
          if (local_a8 < local_90 - local_28) {
            local_a0 = local_88 + local_28;
            HighsCDouble::HighsCDouble(&local_3b0,local_50);
            local_3a0 = HighsCDouble::operator-
                                  (in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58);
            local_390 = HighsCDouble::operator/(in_stack_fffffffffffffb58,3.49973672933618e-317);
            local_a8 = HighsCDouble::operator_cast_to_double(&local_390);
          }
        }
      }
    }
    else {
      local_a8 = local_90;
      local_a0 = local_170;
      if (local_170 < local_80 - local_28) {
        local_a0 = local_80;
        HighsCDouble::HighsCDouble(&local_320,local_50);
        local_310 = HighsCDouble::operator-
                              (in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58);
        local_300 = HighsCDouble::operator/(in_stack_fffffffffffffb58,3.49942991457011e-317);
        local_a8 = HighsCDouble::operator_cast_to_double(&local_300);
        if (local_98 + local_28 < local_a8) {
          local_a0 = local_80 - local_28;
          HighsCDouble::HighsCDouble(&local_350,local_50);
          local_340 = HighsCDouble::operator-
                                (in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58);
          local_330 = HighsCDouble::operator/(in_stack_fffffffffffffb58,3.49952279891153e-317);
          local_a8 = HighsCDouble::operator_cast_to_double(&local_330);
        }
      }
    }
  }
  else if (INFINITY <= local_98) {
    if (local_90 <= -INFINITY) {
      local_2c0 = 0.0;
      pdVar4 = std::max<double>(&local_2c0,&local_80);
      local_a0 = *pdVar4;
      HighsCDouble::HighsCDouble(&local_2f0,local_50);
      local_2e0 = HighsCDouble::operator-
                            (in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58);
      local_2d0 = HighsCDouble::operator/(in_stack_fffffffffffffb58,3.4993068922243e-317);
      local_a8 = HighsCDouble::operator_cast_to_double(&local_2d0);
    }
    else {
      local_a8 = local_90;
      local_a0 = local_170;
      if (local_88 + local_28 < local_170) {
        local_a0 = local_88;
        HighsCDouble::HighsCDouble(&local_288,local_50);
        local_278 = HighsCDouble::operator-
                              (in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58);
        local_268 = HighsCDouble::operator/(in_stack_fffffffffffffb58,3.49912655826356e-317);
        local_a8 = HighsCDouble::operator_cast_to_double(&local_268);
        if (local_98 + local_28 < local_a8) {
          local_a0 = local_88 + local_28;
          HighsCDouble::HighsCDouble(&local_2b8,local_50);
          local_2a8 = HighsCDouble::operator-
                                (in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58);
          local_298 = HighsCDouble::operator/(in_stack_fffffffffffffb58,3.49921944260498e-317);
          local_a8 = HighsCDouble::operator_cast_to_double(&local_298);
        }
      }
    }
  }
  else {
    local_a8 = local_98;
    local_a0 = local_178;
    if (local_178 < local_80 - local_28) {
      local_a0 = local_80;
      HighsCDouble::HighsCDouble(&local_228,local_50);
      local_218 = HighsCDouble::operator-
                            (in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58);
      local_208 = HighsCDouble::operator/(in_stack_fffffffffffffb58,3.49891065157633e-317);
      local_a8 = HighsCDouble::operator_cast_to_double(&local_208);
      if (local_a8 < local_90 - local_28) {
        local_a0 = local_80 - local_28;
        HighsCDouble::HighsCDouble(&local_258,local_50);
        local_248 = HighsCDouble::operator-
                              (in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58);
        local_238 = HighsCDouble::operator/(in_stack_fffffffffffffb58,3.49900353591775e-317);
        local_a8 = HighsCDouble::operator_cast_to_double(&local_238);
      }
    }
  }
LAB_006c16fb:
  local_3f0 = 0x3d719799812dea11;
  HighsCDouble::HighsCDouble(&local_428,local_a0);
  HighsCDouble::HighsCDouble(&local_448,local_a8);
  local_438 = HighsCDouble::operator*
                        ((HighsCDouble *)
                         CONCAT17(in_stack_fffffffffffffb77,
                                  CONCAT16(in_stack_fffffffffffffb76,
                                           CONCAT15(in_stack_fffffffffffffb75,
                                                    CONCAT14(in_stack_fffffffffffffb74,
                                                             in_stack_fffffffffffffb70)))),
                         in_stack_fffffffffffffb68);
  local_418 = HighsCDouble::operator+(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  HighsCDouble::HighsCDouble(&local_458,local_50);
  local_408 = HighsCDouble::operator-(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  local_3f8 = HighsCDouble::operator_cast_to_double(&local_408);
  local_3f8 = ABS(local_3f8);
  bVar2 = undoFix::anon_class_8_1_efae81bf::operator()(&local_48,local_80,local_a0,local_88);
  bVar1 = false;
  if (bVar2) {
    bVar2 = undoFix::anon_class_8_1_efae81bf::operator()(&local_48,local_90,local_a8,local_98);
    bVar1 = false;
    if (bVar2) {
      if ((local_69 & 1) != 0) {
        bVar2 = undoFix::anon_class_8_1_480c3b24::operator()
                          ((anon_class_8_1_480c3b24 *)in_stack_fffffffffffffb60,
                           (double)in_stack_fffffffffffffb58);
        bVar1 = false;
        if (!bVar2) goto LAB_006c190d;
      }
      if ((local_6a & 1) != 0) {
        bVar2 = undoFix::anon_class_8_1_480c3b24::operator()
                          ((anon_class_8_1_480c3b24 *)in_stack_fffffffffffffb60,
                           (double)in_stack_fffffffffffffb58);
        bVar1 = false;
        if (!bVar2) goto LAB_006c190d;
      }
      bVar1 = false;
      if ((ABS(local_a0) < INFINITY) && (bVar1 = false, ABS(local_a8) < INFINITY)) {
        bVar1 = local_3f8 <= 1e-12;
      }
    }
  }
LAB_006c190d:
  undoFix::anon_class_8_1_efae81bf::operator()(&local_48,local_80,local_a0,local_88);
  undoFix::anon_class_8_1_efae81bf::operator()(&local_48,local_90,local_a8,local_98);
  if ((local_69 & 1) != 0) {
    undoFix::anon_class_8_1_480c3b24::operator()
              ((anon_class_8_1_480c3b24 *)in_stack_fffffffffffffb60,
               (double)in_stack_fffffffffffffb58);
  }
  if ((local_6a & 1) != 0) {
    undoFix::anon_class_8_1_480c3b24::operator()
              ((anon_class_8_1_480c3b24 *)in_stack_fffffffffffffb60,
               (double)in_stack_fffffffffffffb58);
  }
  if (bVar1) {
    dVar5 = local_a0;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_70);
    *pvVar3 = dVar5;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_74);
    *pvVar3 = local_a8;
  }
  return;
}

Assistant:

void HighsPostsolveStack::DuplicateColumn::undoFix(
    const HighsOptions& options, HighsSolution& solution) const {
  const double mip_feasibility_tolerance = options.mip_feasibility_tolerance;
  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  std::vector<double>& col_value = solution.col_value;
  const bool allow_assert = false;
  const bool debug_report = false;
  //=============================================================================================

  auto isInteger = [&](const double v) {
    return (fractionality(v) <= mip_feasibility_tolerance);
  };

  auto isFeasible = [&](const double l, const double v, const double u) {
    return v >= l - primal_feasibility_tolerance &&
           v <= u + primal_feasibility_tolerance;
  };
  const double merge_value = col_value[col];
  const double value_max = 1000;
  const double eps = 1e-8;
  const double scale = colScale;
  const bool x_int = colIntegral;
  const bool y_int = duplicateColIntegral;
  const int x_ix = col;
  const int y_ix = duplicateCol;
  const double x_lo =
      x_int ? std::ceil(colLower - mip_feasibility_tolerance) : colLower;
  const double x_up =
      x_int ? std::floor(colUpper + mip_feasibility_tolerance) : colUpper;
  const double y_lo =
      y_int ? std::ceil(duplicateColLower - mip_feasibility_tolerance)
            : duplicateColLower;
  const double y_up =
      y_int ? std::floor(duplicateColUpper + mip_feasibility_tolerance)
            : duplicateColUpper;
  if (kAllowDeveloperAssert) assert(scale);
  double x_v = merge_value;
  double y_v;

  //  assert(x_int);
  //  assert(y_int);
  //  assert(scale < 0);
  if (x_int) {
    double x_0 = 0;
    double x_d = 0;
    double x_1 = 0;
    double x_free = false;
    if (x_lo <= -kHighsInf) {
      if (x_up >= kHighsInf) {
        // x is free
        x_free = true;
        x_0 = 0;
        x_d = 1.0;
        x_1 = value_max;
      } else {
        // x is (-int, u]
        x_0 = x_up;
        x_d = -1.0;
        x_1 = -value_max;
      }
    } else {
      if (x_up >= kHighsInf) {
        // x is [l, inf)
        x_0 = x_lo;
        x_d = 1.0;
        x_1 = value_max;
      } else {
        // x is [l, u]
        x_0 = x_lo;
        x_d = 1.0;
        x_1 = x_up;
      }
    }
    // x is integer, so look through its possible values to find a
    // suitable y
    if (x_free && debug_report) printf("DuplicateColumn::undo x is free\n");
    if (debug_report)
      printf("DuplicateColumn::undo Using x (%g; %g; %g)\n", x_0, x_d, x_1);
    bool found_y = false;
    for (x_v = x_0;; x_v += x_d) {
      //      printf("x_v = %g\n", x_v);
      y_v = double((HighsCDouble(merge_value) - x_v) / scale);
      if (isFeasible(y_lo, y_v, y_up)) {
        found_y = !y_int || isInteger(y_v);
        if (found_y) break;
      }
      if (x_d > 0 && x_v + x_d >= x_1 + eps) break;
      if (x_d < 0 && x_v + x_d <= x_1 - eps) break;
    }
    if (allow_assert) assert(found_y);
  } else if (y_int) {
    double y_0 = 0;
    double y_d = 0;
    double y_1 = 0;
    double y_free = false;
    if (y_lo <= -kHighsInf) {
      if (y_up >= kHighsInf) {
        // y is free
        y_free = true;
        y_0 = 0;
        y_d = 1.0;
        y_1 = value_max;
      } else {
        // y is (-int, u]
        y_0 = y_up;
        y_d = -1.0;
        y_1 = -value_max;
      }
    } else {
      if (y_up >= kHighsInf) {
        // y is [l, inf)
        y_0 = y_lo;
        y_d = 1.0;
        y_1 = value_max;
      } else {
        // y is [l, u]
        y_0 = y_lo;
        y_d = 1.0;
        y_1 = y_up;
      }
    }
    // y is integer, so look through its possible values to find a
    // suitable x
    if (y_free && debug_report) printf("DuplicateColumn::undo y is free\n");
    if (debug_report)
      printf("DuplicateColumn::undo Using y (%g; %g; %g)\n", y_0, y_d, y_1);
    bool found_x = false;
    for (y_v = y_0;; y_v += y_d) {
      //      printf("y_v = %g\n", y_v);
      x_v = double((HighsCDouble(merge_value) - HighsCDouble(y_v) * scale));
      if (isFeasible(x_lo, x_v, x_up)) {
        found_x = !x_int || isInteger(x_v);
        if (found_x) break;
      }
      if (y_d > 0 && y_v + y_d >= y_1 + eps) break;
      if (y_d < 0 && y_v + y_d <= y_1 - eps) break;
    }
    if (allow_assert) assert(found_x);
  } else {
    // x and y are both continuous
    double v_m_a_ylo = 0;
    double v_m_a_yup = 0;
    if (y_lo <= -kHighsInf) {
      v_m_a_ylo = scale > 0 ? kHighsInf : -kHighsInf;
    } else {
      v_m_a_ylo =
          double((HighsCDouble(merge_value) - HighsCDouble(y_lo) * scale));
    }
    if (y_up >= kHighsInf) {
      v_m_a_yup = scale > 0 ? -kHighsInf : kHighsInf;
    } else {
      v_m_a_yup =
          double((HighsCDouble(merge_value) - HighsCDouble(y_up) * scale));
    }
    // Need to ensure that y puts x in [x_l, x_u]
    if (scale > 0) {
      if (debug_report)
        printf("DuplicateColumn::undo [V-a(y_u), V-a(y_l)] == [%g, %g]\n",
               v_m_a_yup, v_m_a_ylo);
      // V-ay is in [V-a(y_u), V-a(y_l)] == [v_m_a_yup, v_m_a_ylo]
      if (y_up < kHighsInf) {
        // If v_m_a_yup is right of x_up+eps then [v_m_a_yup, v_m_a_ylo] is
        // right of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_ylo computed from y_lo-eps.]
        if (kAllowDeveloperAssert)
          assert(x_up + primal_feasibility_tolerance >= v_m_a_yup);
        // This assignment is OK unless x_v < x_lo-eps
        y_v = y_up;
        x_v = v_m_a_yup;
        if (x_v < x_lo - primal_feasibility_tolerance) {
          // Try y_v corresponding to x_lo
          x_v = x_lo;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v < y_lo - primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            x_v = x_lo - primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else if (y_lo > -kHighsInf) {
        // If v_m_a_ylo is left of x_lo-eps then [v_m_a_yup, v_m_a_ylo] is
        // left of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_yup computed from y_up+eps.]
        if (kAllowDeveloperAssert)
          assert(x_lo - primal_feasibility_tolerance <= v_m_a_ylo);
        // This assignment is OK unless x_v > x_up-eps
        y_v = y_lo;
        x_v = v_m_a_ylo;
        if (x_v > x_up + primal_feasibility_tolerance) {
          // Try y_v corresponding to x_up
          //	  if (kAllowDeveloperAssert) assert(1==102);
          x_v = x_up;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v > y_up + primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            if (debug_report) printf("DuplicateColumn::undoFix 2==102\n");
            if (kAllowDeveloperAssert) assert(2 == 102);
            x_v = x_up + primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else {
        // y is free, so use x_v = max(0, x_lo)
        x_v = std::max(0.0, x_lo);
        y_v = double((HighsCDouble(merge_value) - x_v) / scale);
      }
    } else {  // scale < 0
      if (debug_report)
        printf("DuplicateColumn::undo [V-a(y_l), V-a(y_u)] == [%g, %g]\n",
               v_m_a_ylo, v_m_a_yup);
      // V-ay is in [V-a(y_l), V-a(y_u)] == [v_m_a_ylo, v_m_a_yup]
      //
      if (y_lo > -kHighsInf) {
        // If v_m_a_ylo is right of x_up+eps then [v_m_a_ylo, v_m_a_yup] is
        // right of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_ylo computed from y_up+eps.]
        if (kAllowDeveloperAssert)
          assert(x_up + primal_feasibility_tolerance >= v_m_a_ylo);
        // This assignment is OK unless x_v < x_lo-eps
        y_v = y_lo;
        x_v = v_m_a_ylo;
        if (x_v < x_lo - primal_feasibility_tolerance) {
          // Try y_v corresponding to x_lo
          //	  if (kAllowDeveloperAssert) assert(11==101);
          x_v = x_lo;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v > y_up + primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            if (debug_report) printf("DuplicateColumn::undoFix 12==101\n");
            if (kAllowDeveloperAssert) assert(12 == 101);
            x_v = x_lo - primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else if (y_up < kHighsInf) {
        // If v_m_a_yup is left of x_lo-eps then [v_m_a_ylo, v_m_a_yup] is
        // left of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_yup computed from y_lo-eps.]
        if (kAllowDeveloperAssert)
          assert(x_lo - primal_feasibility_tolerance <= v_m_a_yup);
        // This assignment is OK unless x_v < x_lo-eps
        y_v = y_up;
        x_v = v_m_a_yup;
        if (x_v > x_up + primal_feasibility_tolerance) {
          // Try y_v corresponding to x_up
          //	  if (kAllowDeveloperAssert) assert(11==102);
          x_v = x_up;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v < y_lo - primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            if (debug_report) printf("DuplicateColumn::undoFix 12==102\n");
            if (kAllowDeveloperAssert) assert(12 == 102);
            x_v = x_up + primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else {
        // y is free, so use x_v = max(0, x_lo)
        x_v = std::max(0.0, x_lo);
        y_v = double((HighsCDouble(merge_value) - x_v) / scale);
      }
    }
  }
  const double residual_tolerance = 1e-12;
  double residual =
      std::fabs(double(HighsCDouble(x_v) + HighsCDouble(y_v) * scale -
                       HighsCDouble(merge_value)));
  const bool x_y_ok =
      isFeasible(x_lo, x_v, x_up) && isFeasible(y_lo, y_v, y_up) &&
      (!x_int || isInteger(x_v)) && (!y_int || isInteger(y_v)) &&
      (std::fabs(x_v) < kHighsInf) && (std::fabs(y_v) < kHighsInf) &&
      (residual <= residual_tolerance);

  bool check;
  check = isFeasible(x_lo, x_v, x_up);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: isFeasible(x_lo, x_v, x_up) is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = isFeasible(y_lo, y_v, y_up);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: isFeasible(y_lo, y_v, y_up) is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = !x_int || isInteger(x_v);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: !x_int || isInteger(x_v) is false\n");
    if (allow_assert) assert(check);
  }
  check = !y_int || isInteger(y_v);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: !y_int || isInteger(y_v) is false\n");
    if (allow_assert) assert(check);
  }
  check = std::fabs(x_v) < kHighsInf;
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: std::fabs(x_v) < kHighsInf is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = std::fabs(y_v) < kHighsInf;
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: std::fabs(y_v) < kHighsInf is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = residual <= residual_tolerance;
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: residual <= residual_tolerance is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = residual <= residual_tolerance;
  if (debug_report)
    printf("DuplicateColumn::undo%s x = %g; y = %g to give x + (%g)y = %g",
           x_y_ok ? "" : " ERROR", x_v, y_v, scale, merge_value);
  if (x_y_ok) {
    if (debug_report) printf(": FIXED\n");
  } else if (check) {
    if (debug_report) printf("\n");
  } else {
    if (debug_report) printf(": residual = %g\n", residual);
  }
  //=============================================================================================
  if (x_y_ok) {
    col_value[x_ix] = x_v;
    col_value[y_ix] = y_v;
  }
}